

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O3

void joystick_callback(int jid,int event)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  
  if (event == 0x40001) {
    lVar1 = (long)joystick_count;
    joystick_count = joystick_count + 1;
    joysticks[lVar1] = jid;
  }
  else if (event == 0x40002) {
    uVar2 = 0;
    if (0 < joystick_count) {
      piVar4 = joysticks;
      do {
        if (*piVar4 == jid) goto LAB_00141cd1;
        uVar2 = uVar2 + 1;
        piVar4 = piVar4 + 1;
      } while ((uint)joystick_count != uVar2);
      uVar2 = (ulong)(uint)joystick_count;
    }
LAB_00141cd1:
    iVar3 = (int)uVar2 + 1;
    if (iVar3 < joystick_count) {
      uVar2 = uVar2 & 0xffffffff;
      do {
        joysticks[uVar2 & 0xffffffff] = joysticks[uVar2 + 1];
        uVar2 = uVar2 + 1;
        iVar3 = iVar3 + 1;
      } while (iVar3 < joystick_count);
    }
    joystick_count = joystick_count + -1;
  }
  iVar3 = glfwGetWindowAttrib(window,0x20001);
  if (iVar3 != 0) {
    return;
  }
  glfwRequestWindowAttention(window);
  return;
}

Assistant:

static void joystick_callback(int jid, int event)
{
    if (event == GLFW_CONNECTED)
        joysticks[joystick_count++] = jid;
    else if (event == GLFW_DISCONNECTED)
    {
        int i;

        for (i = 0;  i < joystick_count;  i++)
        {
            if (joysticks[i] == jid)
                break;
        }

        for (i = i + 1;  i < joystick_count;  i++)
            joysticks[i - 1] = joysticks[i];

        joystick_count--;
    }

    if (!glfwGetWindowAttrib(window, GLFW_FOCUSED))
        glfwRequestWindowAttention(window);
}